

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void snowhouse::ConfigurableAssert<snowhouse::DefaultFailureHandler>::
     That<int,snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>
               (int *actual,
               ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,_snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>_>,_snowhouse::Nil>_>_>
               *expression,char *file_name,int line_number)

{
  _Elt_pointer ppCVar1;
  string *this;
  string local_110 [32];
  OperatorStack operators;
  ResultStack result;
  allocator local_50 [32];
  
  std::stack<bool,std::deque<bool,std::allocator<bool>>>::
  stack<std::deque<bool,std::allocator<bool>>,void>(&result);
  std::
  stack<snowhouse::ConstraintOperator*,std::deque<snowhouse::ConstraintOperator*,std::allocator<snowhouse::ConstraintOperator*>>>
  ::
  stack<std::deque<snowhouse::ConstraintOperator*,std::allocator<snowhouse::ConstraintOperator*>>,void>
            (&operators);
  EvaluateConstraintList<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>,int>
            (&expression->m_constraint_list,&result,&operators,actual);
  while (operators.c.
         super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
         ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         operators.c.
         super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
         ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppCVar1 = operators.c.
              super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (operators.c.
        super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        operators.c.
        super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppCVar1 = operators.c.
                super__Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    (**ppCVar1[-1]->_vptr_ConstraintOperator)(ppCVar1[-1],&result);
    std::deque<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>::
    pop_back(&operators.c);
  }
  if (result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur !=
      result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    if (result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur ==
        result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_first) {
      result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur =
           result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
           _M_finish._M_node[-1] + 0x200;
    }
    if (result.c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_cur[-1] == false) {
      DefaultFailureHandler::
      Handle<snowhouse::ExpressionBuilder<snowhouse::ConstraintList<snowhouse::NotOperator,snowhouse::ConstraintList<snowhouse::ConstraintAdapter<snowhouse::EqualsConstraint<int>>,snowhouse::Nil>>>,int>
                (expression,actual,file_name,line_number);
    }
    std::
    _Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>::
    ~_Deque_base((_Deque_base<snowhouse::ConstraintOperator_*,_std::allocator<snowhouse::ConstraintOperator_*>_>
                  *)&operators);
    std::_Deque_base<bool,_std::allocator<bool>_>::~_Deque_base
              ((_Deque_base<bool,_std::allocator<bool>_> *)&result);
    return;
  }
  this = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(local_110,"The expression did not yield any result",local_50);
  std::__cxx11::string::string(this,local_110);
  __cxa_throw(this,&InvalidExpressionException::typeinfo,
              InvalidExpressionException::~InvalidExpressionException);
}

Assistant:

static void That(const ActualType& actual, ExpressionBuilder<ConstraintListType> expression, const char* file_name, int line_number)
      {
         try 
         {
            ResultStack result;
            OperatorStack operators;
            expression.Evaluate(result, operators, actual);

            while (!operators.empty())
            {
               ConstraintOperator* op = operators.top();
               op->PerformOperation(result);
               operators.pop();
            }

            if (result.empty())
            {
               throw InvalidExpressionException("The expression did not yield any result");
            }

            if (!result.top())
            {
               FailureHandler::Handle(expression, actual, file_name, line_number);
            }      
         }
         catch (const InvalidExpressionException& e) 
         {
            FailureHandler::Handle("Malformed expression: \"" + snowhouse::Stringize(expression) + "\"\n" + e.Message());
         }
      }